

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm_int8.h
# Opt level: O1

void ncnn::lstm_dynamic_quantize_scale2int8(float *ptr,int size,float scale,char *outptr)

{
  undefined1 auVar1 [32];
  uint uVar2;
  uint uVar3;
  long lVar4;
  int iVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 in_ZMM7 [64];
  undefined1 auVar22 [64];
  undefined1 auVar21 [32];
  
  uVar2 = 0;
  if (7 < size) {
    uVar2 = size & 0x7ffffff8;
    iVar5 = 7;
    auVar9._8_4_ = 0x80000000;
    auVar9._0_8_ = 0x8000000080000000;
    auVar9._12_4_ = 0x80000000;
    auVar9._16_4_ = 0x80000000;
    auVar9._20_4_ = 0x80000000;
    auVar9._24_4_ = 0x80000000;
    auVar9._28_4_ = 0x80000000;
    auVar12._8_4_ = 0x3f000000;
    auVar12._0_8_ = 0x3f0000003f000000;
    auVar12._12_4_ = 0x3f000000;
    auVar12._16_4_ = 0x3f000000;
    auVar12._20_4_ = 0x3f000000;
    auVar12._24_4_ = 0x3f000000;
    auVar12._28_4_ = 0x3f000000;
    auVar11._8_2_ = 0x7f;
    auVar11._0_8_ = 0x7f007f007f007f;
    auVar11._10_2_ = 0x7f;
    auVar11._12_2_ = 0x7f;
    auVar11._14_2_ = 0x7f;
    auVar14._8_2_ = 0xff81;
    auVar14._0_8_ = 0xff81ff81ff81ff81;
    auVar14._10_2_ = 0xff81;
    auVar14._12_2_ = 0xff81;
    auVar14._14_2_ = 0xff81;
    auVar16[8] = 0x7f;
    auVar16._0_8_ = 0x7f7f7f7f7f7f7f7f;
    auVar16[9] = 0x7f;
    auVar16[10] = 0x7f;
    auVar16[0xb] = 0x7f;
    auVar16[0xc] = 0x7f;
    auVar16[0xd] = 0x7f;
    auVar16[0xe] = 0x7f;
    auVar16[0xf] = 0x7f;
    do {
      auVar22._0_4_ = scale * *ptr;
      auVar22._4_4_ = scale * ptr[1];
      auVar22._8_4_ = scale * ptr[2];
      auVar22._12_4_ = scale * ptr[3];
      auVar22._16_4_ = scale * ptr[4];
      auVar22._20_4_ = scale * ptr[5];
      auVar22._28_36_ = in_ZMM7._28_36_;
      auVar22._24_4_ = scale * ptr[6];
      auVar1 = vandps_avx(auVar22._0_32_,auVar9);
      auVar1 = vorps_avx(auVar1,auVar12);
      auVar18._0_4_ = (int)(auVar1._0_4_ + auVar22._0_4_);
      auVar18._4_4_ = (int)(auVar1._4_4_ + auVar22._4_4_);
      auVar18._8_4_ = (int)(auVar1._8_4_ + auVar22._8_4_);
      auVar18._12_4_ = (int)(auVar1._12_4_ + auVar22._12_4_);
      auVar21._16_4_ = (int)(auVar1._16_4_ + auVar22._16_4_);
      auVar21._0_16_ = auVar18;
      auVar21._20_4_ = (int)(auVar1._20_4_ + auVar22._20_4_);
      auVar21._24_4_ = (int)(auVar1._24_4_ + auVar22._24_4_);
      auVar21._28_4_ = (int)(auVar1._28_4_ + in_ZMM7._28_4_);
      auVar18 = vpackssdw_avx(auVar18,auVar21._16_16_);
      auVar18 = vpminsw_avx(auVar18,auVar11);
      auVar18 = vpmaxsw_avx(auVar18,auVar14);
      auVar18 = vpacksswb_avx(auVar18,auVar18);
      auVar18 = vpaddb_avx(auVar18,auVar16);
      in_ZMM7 = ZEXT1664(auVar18);
      *(long *)outptr = auVar18._0_8_;
      ptr = ptr + 8;
      outptr = outptr + 8;
      iVar5 = iVar5 + 8;
    } while (iVar5 < size);
  }
  if ((int)(uVar2 | 3) < size) {
    auVar7._8_4_ = 0x80000000;
    auVar7._0_8_ = 0x8000000080000000;
    auVar7._12_4_ = 0x80000000;
    auVar10._8_4_ = 0x3f000000;
    auVar10._0_8_ = 0x3f0000003f000000;
    auVar10._12_4_ = 0x3f000000;
    auVar13._8_2_ = 0x7f;
    auVar13._0_8_ = 0x7f007f007f007f;
    auVar13._10_2_ = 0x7f;
    auVar13._12_2_ = 0x7f;
    auVar13._14_2_ = 0x7f;
    auVar15._8_2_ = 0xff81;
    auVar15._0_8_ = 0xff81ff81ff81ff81;
    auVar15._10_2_ = 0xff81;
    auVar15._12_2_ = 0xff81;
    auVar15._14_2_ = 0xff81;
    auVar17[8] = 0x7f;
    auVar17._0_8_ = 0x7f7f7f7f7f7f7f7f;
    auVar17[9] = 0x7f;
    auVar17[10] = 0x7f;
    auVar17[0xb] = 0x7f;
    auVar17[0xc] = 0x7f;
    auVar17[0xd] = 0x7f;
    auVar17[0xe] = 0x7f;
    auVar17[0xf] = 0x7f;
    uVar3 = uVar2;
    do {
      auVar19._0_4_ = scale * *ptr;
      auVar19._4_4_ = scale * ptr[1];
      auVar19._8_4_ = scale * ptr[2];
      auVar19._12_4_ = scale * ptr[3];
      auVar11 = vandps_avx(auVar19,auVar7);
      auVar11 = vorps_avx(auVar11,auVar10);
      auVar20._0_4_ = (int)(auVar11._0_4_ + auVar19._0_4_);
      auVar20._4_4_ = (int)(auVar11._4_4_ + auVar19._4_4_);
      auVar20._8_4_ = (int)(auVar11._8_4_ + auVar19._8_4_);
      auVar20._12_4_ = (int)(auVar11._12_4_ + auVar19._12_4_);
      auVar11 = vpackssdw_avx(auVar20,auVar20);
      auVar11 = vpminsw_avx(auVar11,auVar13);
      auVar11 = vpmaxsw_avx(auVar11,auVar15);
      auVar11 = vpacksswb_avx(auVar11,auVar11);
      auVar11 = vpaddb_avx(auVar11,auVar17);
      *(int *)outptr = auVar11._0_4_;
      ptr = ptr + 4;
      outptr = outptr + 4;
      uVar2 = uVar3 + 4;
      iVar5 = uVar3 + 7;
      uVar3 = uVar2;
    } while (iVar5 < size);
  }
  if ((int)uVar2 < size) {
    lVar4 = 0;
    auVar6._8_4_ = 0x80000000;
    auVar6._0_8_ = 0x8000000080000000;
    auVar6._12_4_ = 0x80000000;
    auVar8._8_4_ = 0x3effffff;
    auVar8._0_8_ = 0x3effffff3effffff;
    auVar8._12_4_ = 0x3effffff;
    do {
      auVar11 = vandps_avx(ZEXT416((uint)(scale * ptr[lVar4])),auVar6);
      auVar11 = vorps_avx(auVar11,auVar8);
      auVar11 = ZEXT416((uint)(scale * ptr[lVar4] + auVar11._0_4_));
      auVar11 = vroundss_avx(auVar11,auVar11,0xb);
      iVar5 = (int)auVar11._0_4_;
      if (iVar5 < -0x7e) {
        iVar5 = -0x7f;
      }
      if (0x7e < iVar5) {
        iVar5 = 0x7f;
      }
      outptr[lVar4] = (char)iVar5;
      lVar4 = lVar4 + 1;
    } while (size - uVar2 != (int)lVar4);
  }
  return;
}

Assistant:

static void lstm_dynamic_quantize_scale2int8(const float* ptr, int size, float scale, signed char* outptr)
{
#if NCNN_RUNTIME_CPU && NCNN_AVX512VNNI && __AVX512F__ && !__AVX512VNNI__
    if (ncnn::cpu_support_x86_avx512_vnni())
    {
        lstm_dynamic_quantize_scale2int8_avx512vnni(ptr, size, scale, outptr);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVXVNNI && __AVX__ && !__AVX512F__ && !__AVXVNNI__ && !__AVX512VNNI__
    if (ncnn::cpu_support_x86_avx_vnni())
    {
        lstm_dynamic_quantize_scale2int8_avxvnni(ptr, size, scale, outptr);
        return;
    }
#endif

    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
    __m512 _scale_avx512 = _mm512_set1_ps(scale);
#if __AVX512VNNI__
    __m128i _v127 = _mm_set1_epi8(127);
#endif
    for (; i + 15 < size; i += 16)
    {
        __m512 _p = _mm512_loadu_ps(ptr);
        _p = _mm512_mul_ps(_p, _scale_avx512);
        __m128i _outp = float2int8_avx512(_p);
#if __AVX512VNNI__
        _outp = _mm_add_epi8(_outp, _v127);
#endif
        _mm_storeu_si128((__m128i*)outptr, _outp);
        ptr += 16;
        outptr += 16;
    }
#endif // __AVX512F__
    __m256 _scale_avx = _mm256_set1_ps(scale);
    for (; i + 7 < size; i += 8)
    {
        __m256 _p = _mm256_loadu_ps(ptr);
        _p = _mm256_mul_ps(_p, _scale_avx);
        *(int64_t*)outptr = float2int8_avx(_p);
#if __AVXVNNI__ || __AVX512VNNI__
        outptr[0] += 127;
        outptr[1] += 127;
        outptr[2] += 127;
        outptr[3] += 127;
        outptr[4] += 127;
        outptr[5] += 127;
        outptr[6] += 127;
        outptr[7] += 127;
#endif
        ptr += 8;
        outptr += 8;
    }
#endif // __AVX__
    __m128 _scale = _mm_set1_ps(scale);
    for (; i + 3 < size; i += 4)
    {
        __m128 _p = _mm_loadu_ps(ptr);
        _p = _mm_mul_ps(_p, _scale);
        *(int32_t*)outptr = float2int8_sse(_p);
#ifndef _MSC_VER
        // vs2019 crash on 128bit vnni :L   --- nihui
#if __AVXVNNI__ || __AVX512VNNI__
        outptr[0] += 127;
        outptr[1] += 127;
        outptr[2] += 127;
        outptr[3] += 127;
#endif
#endif
        ptr += 4;
        outptr += 4;
    }
#endif // __SSE2__
    for (; i < size; i++)
    {
        *outptr++ = float2int8(*ptr++ * scale);
    }
}